

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrandom.h
# Opt level: O2

quint64 __thiscall QRandomGenerator::bounded(QRandomGenerator *this,quint64 highest)

{
  long lVar1;
  ulong uVar2;
  quint64 qVar3;
  byte bVar4;
  
  uVar2 = highest - 1;
  if (uVar2 == 0) {
    bVar4 = 0;
  }
  else {
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    bVar4 = (byte)lVar1 ^ 0x3f;
  }
  do {
    qVar3 = generate64(this);
    uVar2 = qVar3 & ~(-1L << (-bVar4 & 0x3f));
  } while (highest <= uVar2);
  return uVar2;
}

Assistant:

inline quint64 QRandomGenerator::bounded(quint64 highest)
{
    // Implement an algorithm similar to libc++'s uniform_int_distribution:
    // loop around getting a random number, mask off any bits that "highest"
    // will never need, then check if it's higher than "highest". The number of
    // times the loop will run is unbounded but the probability of terminating
    // is better than 1/2 on each iteration. Therefore, the average loop count
    // should be less than 2.

    const int width = qCountLeadingZeroBits(highest - 1);
    const quint64 mask = (quint64(1) << (std::numeric_limits<quint64>::digits - width)) - 1;
    quint64 v;
    do {
        v = generate64() & mask;
    } while (v >= highest);
    return v;
}